

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O3

bool test_uintwide_t_edge::test_various_ostream_ops(void)

{
  short *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  short *psVar3;
  uint *puVar4;
  long lVar5;
  size_t sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  unsigned_long uVar12;
  ulong uVar13;
  byte bVar14;
  long lVar15;
  undefined8 *puVar16;
  uint i_2;
  uint i;
  undefined8 unaff_R15;
  undefined7 uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  string str_ctrl;
  uintwide_t<256U,_unsigned_short,_void,_false> result_max;
  uintwide_t<256U,_unsigned_short,_void,_false> u;
  stringstream strm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  uintwide_t<256U,_unsigned_short,_void,_false> local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  uVar12 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  uVar13 = 0x12dd397;
  if (uVar12 != 0) {
    uVar13 = uVar12 % 0x7fffffab + (ulong)(uVar12 % 0x7fffffab == 0);
  }
  lVar15 = 0;
  puVar16 = &eng_sgn;
  do {
    uVar13 = (uVar13 * 0x9c4e) % 0x7fffffab;
    *(ulong *)((long)&eng_sgn + lVar15) = (ulong)((uint)uVar13 & 0xffffff);
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0xc0);
  _DAT_0020b3e8 = (ulong)(DAT_0020b3e0 == 0);
  _DAT_0020b3f0 = (undefined1  [16])0x0;
  uVar12 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>::seed
            ((subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL> *)&eng_dig,uVar12);
  _DAT_0020b470 = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0x72b3;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
  puVar4 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
  *puVar4 = *puVar4 | 0x200;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 100;
  lVar15 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar15 + 1] == '\0') {
    std::ios::widen((char)&local_228 + (char)lVar15 + -0x80);
    acStack_c8[lVar15 + 1] = '\x01';
  }
  acStack_c8[lVar15] = '#';
  math::wide_integer::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&local_1d8);
  paVar2 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_228,100,'#');
  uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                    CONCAT24(local_228._M_string_length._4_2_,(undefined4)local_228._M_string_length
                            ));
  lVar15 = uVar13 - 5;
  if (4 < uVar13) {
    local_228._M_dataplus._M_p[lVar15] = '2';
    uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                      CONCAT24(local_228._M_string_length._4_2_,
                               (undefined4)local_228._M_string_length));
    lVar15 = uVar13 - 4;
    if (3 < uVar13) {
      local_228._M_dataplus._M_p[lVar15] = '9';
      uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                        CONCAT24(local_228._M_string_length._4_2_,
                                 (undefined4)local_228._M_string_length));
      lVar15 = uVar13 - 3;
      if (2 < uVar13) {
        local_228._M_dataplus._M_p[lVar15] = '3';
        uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                          CONCAT24(local_228._M_string_length._4_2_,
                                   (undefined4)local_228._M_string_length));
        lVar15 = uVar13 - 2;
        if (1 < uVar13) {
          local_228._M_dataplus._M_p[lVar15] = '6';
          lVar5 = CONCAT26(local_228._M_string_length._6_2_,
                           CONCAT24(local_228._M_string_length._4_2_,
                                    (undefined4)local_228._M_string_length));
          lVar15 = lVar5 + -1;
          if (lVar5 != 0) {
            local_228._M_dataplus._M_p[lVar15] = '3';
            std::__cxx11::stringbuf::str();
            uVar8 = uStack_1f4;
            uVar7 = local_1f8;
            sVar6 = CONCAT44(uStack_1ec,uStack_1f0);
            if (sVar6 == CONCAT26(local_228._M_string_length._6_2_,
                                  CONCAT24(local_228._M_string_length._4_2_,
                                           (undefined4)local_228._M_string_length))) {
              uVar17 = (undefined7)((ulong)unaff_R15 >> 8);
              if (sVar6 == 0) {
                bVar18 = true;
              }
              else {
                iVar9 = bcmp((void *)CONCAT44(uStack_1f4,local_1f8),local_228._M_dataplus._M_p,sVar6
                            );
                bVar18 = iVar9 == 0;
              }
            }
            else {
              bVar18 = false;
              uVar17 = 0;
            }
            if ((undefined4 *)CONCAT44(uVar8,uVar7) != &local_1e8) {
              operator_delete((undefined4 *)CONCAT44(uVar8,uVar7),CONCAT44(uStack_1e4,local_1e8) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != paVar2) {
              operator_delete(local_228._M_dataplus._M_p,
                              CONCAT26(local_228.field_2._M_allocated_capacity._6_2_,
                                       CONCAT24(local_228.field_2._M_allocated_capacity._4_2_,
                                                CONCAT22(local_228.field_2._M_allocated_capacity.
                                                         _2_2_,local_228.field_2.
                                                               _M_allocated_capacity._0_2_))) + 1);
            }
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0xa2f7;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
            local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
            std::__cxx11::stringstream::stringstream(local_1b8);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            puVar4 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
            *puVar4 = *puVar4 | 0x4000;
            puVar4 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
            *puVar4 = *puVar4 | 0x200;
            *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 100;
            lVar15 = *(long *)(local_1a8[0] + -0x18);
            if (acStack_c8[lVar15 + 1] == '\0') {
              std::ios::widen((char)&local_228 + (char)lVar15 + -0x80);
              acStack_c8[lVar15 + 1] = '\x01';
            }
            acStack_c8[lVar15] = '#';
            math::wide_integer::operator<<
                      ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&local_1d8);
            local_228._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_228,100,'#');
            uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                              CONCAT24(local_228._M_string_length._4_2_,
                                       (undefined4)local_228._M_string_length));
            lVar15 = uVar13 - 6;
            if (5 < uVar13) {
              local_228._M_dataplus._M_p[lVar15] = '0';
              uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                                CONCAT24(local_228._M_string_length._4_2_,
                                         (undefined4)local_228._M_string_length));
              lVar15 = uVar13 - 5;
              if (4 < uVar13) {
                local_228._M_dataplus._M_p[lVar15] = 'X';
                uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                                  CONCAT24(local_228._M_string_length._4_2_,
                                           (undefined4)local_228._M_string_length));
                lVar15 = uVar13 - 4;
                if (3 < uVar13) {
                  local_228._M_dataplus._M_p[lVar15] = 'A';
                  uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                                    CONCAT24(local_228._M_string_length._4_2_,
                                             (undefined4)local_228._M_string_length));
                  lVar15 = uVar13 - 3;
                  if (2 < uVar13) {
                    local_228._M_dataplus._M_p[lVar15] = '2';
                    uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                                      CONCAT24(local_228._M_string_length._4_2_,
                                               (undefined4)local_228._M_string_length));
                    lVar15 = uVar13 - 2;
                    if (1 < uVar13) {
                      local_228._M_dataplus._M_p[lVar15] = 'F';
                      lVar5 = CONCAT26(local_228._M_string_length._6_2_,
                                       CONCAT24(local_228._M_string_length._4_2_,
                                                (undefined4)local_228._M_string_length));
                      lVar15 = lVar5 + -1;
                      if (lVar5 != 0) {
                        local_228._M_dataplus._M_p[lVar15] = '7';
                        std::__cxx11::stringbuf::str();
                        uVar8 = uStack_1f4;
                        uVar7 = local_1f8;
                        sVar6 = CONCAT44(uStack_1ec,uStack_1f0);
                        if (sVar6 == CONCAT26(local_228._M_string_length._6_2_,
                                              CONCAT24(local_228._M_string_length._4_2_,
                                                       (undefined4)local_228._M_string_length))) {
                          if (sVar6 == 0) {
                            bVar19 = true;
                          }
                          else {
                            iVar9 = bcmp((void *)CONCAT44(uStack_1f4,local_1f8),
                                         local_228._M_dataplus._M_p,sVar6);
                            bVar19 = iVar9 == 0;
                          }
                        }
                        else {
                          bVar19 = false;
                        }
                        if ((undefined4 *)CONCAT44(uVar8,uVar7) != &local_1e8) {
                          operator_delete((undefined4 *)CONCAT44(uVar8,uVar7),
                                          CONCAT44(uStack_1e4,local_1e8) + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_228._M_dataplus._M_p != paVar2) {
                          operator_delete(local_228._M_dataplus._M_p,
                                          CONCAT26(local_228.field_2._M_allocated_capacity._6_2_,
                                                   CONCAT24(local_228.field_2._M_allocated_capacity.
                                                            _4_2_,CONCAT22(local_228.field_2.
                                                                           _M_allocated_capacity.
                                                                           _2_2_,local_228.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._0_2_))) + 1);
                        }
                        std::__cxx11::stringstream::~stringstream(local_1b8);
                        std::ios_base::~ios_base(local_138);
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0x72b3;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
                        local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
                        std::__cxx11::stringstream::stringstream(local_1b8);
                        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) &
                             0xffffffb5 | 0x40;
                        puVar4 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
                        *puVar4 = *puVar4 | 0x4000;
                        puVar4 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
                        *puVar4 = *puVar4 | 0x200;
                        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 100;
                        lVar15 = *(long *)(local_1a8[0] + -0x18);
                        if (acStack_c8[lVar15 + 1] == '\0') {
                          std::ios::widen((char)&local_228 + (char)lVar15 + -0x80);
                          acStack_c8[lVar15 + 1] = '\x01';
                        }
                        acStack_c8[lVar15] = '#';
                        math::wide_integer::operator<<
                                  ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
                                   &local_1d8);
                        local_228._M_dataplus._M_p = (pointer)paVar2;
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        _M_construct(&local_228,100,'#');
                        uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                                          CONCAT24(local_228._M_string_length._4_2_,
                                                   (undefined4)local_228._M_string_length));
                        lVar15 = uVar13 - 6;
                        if (5 < uVar13) {
                          local_228._M_dataplus._M_p[lVar15] = '0';
                          uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                                            CONCAT24(local_228._M_string_length._4_2_,
                                                     (undefined4)local_228._M_string_length));
                          lVar15 = uVar13 - 5;
                          if (4 < uVar13) {
                            local_228._M_dataplus._M_p[lVar15] = '7';
                            uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                                              CONCAT24(local_228._M_string_length._4_2_,
                                                       (undefined4)local_228._M_string_length));
                            lVar15 = uVar13 - 4;
                            if (3 < uVar13) {
                              local_228._M_dataplus._M_p[lVar15] = '1';
                              uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                                                CONCAT24(local_228._M_string_length._4_2_,
                                                         (undefined4)local_228._M_string_length));
                              lVar15 = uVar13 - 3;
                              if (2 < uVar13) {
                                local_228._M_dataplus._M_p[lVar15] = '2';
                                uVar13 = CONCAT26(local_228._M_string_length._6_2_,
                                                  CONCAT24(local_228._M_string_length._4_2_,
                                                           (undefined4)local_228._M_string_length));
                                lVar15 = uVar13 - 2;
                                if (1 < uVar13) {
                                  local_228._M_dataplus._M_p[lVar15] = '6';
                                  lVar5 = CONCAT26(local_228._M_string_length._6_2_,
                                                   CONCAT24(local_228._M_string_length._4_2_,
                                                            (undefined4)local_228._M_string_length))
                                  ;
                                  lVar15 = lVar5 + -1;
                                  if (lVar5 != 0) {
                                    local_228._M_dataplus._M_p[lVar15] = '3';
                                    std::__cxx11::stringbuf::str();
                                    uVar8 = uStack_1f4;
                                    uVar7 = local_1f8;
                                    sVar6 = CONCAT44(uStack_1ec,uStack_1f0);
                                    if (sVar6 == CONCAT26(local_228._M_string_length._6_2_,
                                                          CONCAT24(local_228._M_string_length._4_2_,
                                                                   (undefined4)
                                                                   local_228._M_string_length))) {
                                      if (sVar6 == 0) {
                                        bVar20 = true;
                                      }
                                      else {
                                        iVar9 = bcmp((void *)CONCAT44(uStack_1f4,local_1f8),
                                                     local_228._M_dataplus._M_p,sVar6);
                                        bVar20 = iVar9 == 0;
                                      }
                                    }
                                    else {
                                      bVar20 = false;
                                    }
                                    if ((undefined4 *)CONCAT44(uVar8,uVar7) != &local_1e8) {
                                      operator_delete((undefined4 *)CONCAT44(uVar8,uVar7),
                                                      CONCAT44(uStack_1e4,local_1e8) + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_228._M_dataplus._M_p != paVar2) {
                                      operator_delete(local_228._M_dataplus._M_p,
                                                      CONCAT26(local_228.field_2.
                                                               _M_allocated_capacity._6_2_,
                                                               CONCAT24(local_228.field_2.
                                                                        _M_allocated_capacity._4_2_,
                                                                        CONCAT22(local_228.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._2_2_,
                                                  local_228.field_2._M_allocated_capacity._0_2_))) +
                                                  1);
                                    }
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0
                                    ;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
                                    std::__cxx11::stringstream::stringstream(local_1b8);
                                    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                                         *(uint *)((long)auStack_190 +
                                                  *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 |
                                         0x40;
                                    math::wide_integer::operator<<
                                              ((basic_ostream<char,_std::char_traits<char>_> *)
                                               local_1a8,&local_1d8);
                                    std::__cxx11::stringbuf::str();
                                    iVar9 = std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            ::compare(&local_228,"0");
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_228._M_dataplus._M_p != &local_228.field_2) {
                                      operator_delete(local_228._M_dataplus._M_p,
                                                      CONCAT26(local_228.field_2.
                                                               _M_allocated_capacity._6_2_,
                                                               CONCAT24(local_228.field_2.
                                                                        _M_allocated_capacity._4_2_,
                                                                        CONCAT22(local_228.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._2_2_,
                                                  local_228.field_2._M_allocated_capacity._0_2_))) +
                                                  1);
                                    }
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    std::__cxx11::stringstream::stringstream(local_1b8);
                                    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                                         *(uint *)((long)auStack_190 +
                                                  *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 2;
                                    math::wide_integer::operator<<
                                              ((basic_ostream<char,_std::char_traits<char>_> *)
                                               local_1a8,&local_1d8);
                                    std::__cxx11::stringbuf::str();
                                    iVar10 = std::__cxx11::
                                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             ::compare(&local_228,"0");
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_228._M_dataplus._M_p != &local_228.field_2) {
                                      operator_delete(local_228._M_dataplus._M_p,
                                                      CONCAT26(local_228.field_2.
                                                               _M_allocated_capacity._6_2_,
                                                               CONCAT24(local_228.field_2.
                                                                        _M_allocated_capacity._4_2_,
                                                                        CONCAT22(local_228.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._2_2_,
                                                  local_228.field_2._M_allocated_capacity._0_2_))) +
                                                  1);
                                    }
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    std::__cxx11::stringstream::stringstream(local_1b8);
                                    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                                         *(uint *)((long)auStack_190 +
                                                  *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
                                    math::wide_integer::operator<<
                                              ((basic_ostream<char,_std::char_traits<char>_> *)
                                               local_1a8,&local_1d8);
                                    std::__cxx11::stringbuf::str();
                                    uVar13 = CONCAT71(uVar17,bVar18 & bVar19 & bVar20) & 0xffffffff;
                                    iVar11 = std::__cxx11::
                                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             ::compare(&local_228,"0");
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_228._M_dataplus._M_p != &local_228.field_2) {
                                      operator_delete(local_228._M_dataplus._M_p,
                                                      CONCAT26(local_228.field_2.
                                                               _M_allocated_capacity._6_2_,
                                                               CONCAT24(local_228.field_2.
                                                                        _M_allocated_capacity._4_2_,
                                                                        CONCAT22(local_228.field_2.
                                                                                                                                                                  
                                                  _M_allocated_capacity._2_2_,
                                                  local_228.field_2._M_allocated_capacity._0_2_))) +
                                                  1);
                                    }
                                    local_1fc = (undefined4)
                                                CONCAT71((int7)(uVar13 >> 8),
                                                         (byte)uVar13 &
                                                         ((iVar10 == 0 && iVar9 == 0) && iVar11 == 0
                                                         ));
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    iVar9 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                                                (&local_1d8,(test_uintwide_t_edge *)0x1,false,0x4d,
                                                 (int)puVar16);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 2;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,&local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_228._M_dataplus._M_p._0_4_ = 0;
                                      local_228._M_dataplus._M_p._4_4_ = 0;
                                      local_228._M_string_length._0_4_ = 0;
                                      local_228._M_string_length._4_2_ = 0;
                                      local_228._M_string_length._6_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_228.field_2._8_2_ = 0;
                                      local_228.field_2._10_2_ = 0;
                                      local_228.field_2._12_2_ = 0;
                                      local_228.field_2._14_2_ = 0;
                                      bVar18 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_false>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_false> *)
                                                  &local_228,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar18) {
                                        local_228.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_228.field_2._8_2_ = 0xffff;
                                        local_228.field_2._10_2_ = 0xffff;
                                        local_228.field_2._12_2_ = 0xffff;
                                        local_228.field_2._14_2_ = 0xffff;
                                        local_228._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_228._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_228._M_string_length._0_4_ = 0xffffffff;
                                        local_228._M_string_length._4_2_ = 0xffff;
                                        local_228._M_string_length._6_2_ = 0xffff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      lVar15 = 0x1e;
                                      do {
                                        if (lVar15 == -2) goto LAB_00112c20;
                                        psVar3 = (short *)((long)local_1d8.values.
                                                                 super_array<unsigned_short,_16UL>.
                                                                 elems + lVar15);
                                        psVar1 = (short *)((long)&local_228._M_dataplus._M_p +
                                                          lVar15);
                                        lVar15 = lVar15 + -2;
                                      } while (*psVar3 == *psVar1);
                                      local_1fc = 0;
LAB_00112c20:
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar9 = iVar9 + 1;
                                    } while (iVar9 != 0x400);
                                    iVar9 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                                                (&local_1d8,(test_uintwide_t_edge *)0x1,true,0x40,
                                                 (int)puVar16);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 8;
                                      puVar4 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar4 = *puVar4 | 0x200;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,&local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_228._M_dataplus._M_p._0_4_ = 0;
                                      local_228._M_dataplus._M_p._4_4_ = 0;
                                      local_228._M_string_length._0_4_ = 0;
                                      local_228._M_string_length._4_2_ = 0;
                                      local_228._M_string_length._6_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_228.field_2._8_2_ = 0;
                                      local_228.field_2._10_2_ = 0;
                                      local_228.field_2._12_2_ = 0;
                                      local_228.field_2._14_2_ = 0;
                                      bVar18 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_false>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_false> *)
                                                  &local_228,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar18) {
                                        local_228.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_228.field_2._8_2_ = 0xffff;
                                        local_228.field_2._10_2_ = 0xffff;
                                        local_228.field_2._12_2_ = 0xffff;
                                        local_228.field_2._14_2_ = 0xffff;
                                        local_228._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_228._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_228._M_string_length._0_4_ = 0xffffffff;
                                        local_228._M_string_length._4_2_ = 0xffff;
                                        local_228._M_string_length._6_2_ = 0xffff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      lVar15 = 0x1e;
                                      do {
                                        if (lVar15 == -2) goto LAB_00112d4a;
                                        psVar3 = (short *)((long)local_1d8.values.
                                                                 super_array<unsigned_short,_16UL>.
                                                                 elems + lVar15);
                                        psVar1 = (short *)((long)&local_228._M_dataplus._M_p +
                                                          lVar15);
                                        lVar15 = lVar15 + -2;
                                      } while (*psVar3 == *psVar1);
                                      local_1fc = 0;
LAB_00112d4a:
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar9 = iVar9 + 1;
                                    } while (iVar9 != 0x400);
                                    iVar9 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                                                (&local_1d8,(test_uintwide_t_edge *)0x1,true,0x55,
                                                 (int)puVar16);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 0x40;
                                      puVar4 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar4 = *puVar4 | 0x200;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,&local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_228._M_dataplus._M_p._0_4_ = 0;
                                      local_228._M_dataplus._M_p._4_4_ = 0;
                                      local_228._M_string_length._0_4_ = 0;
                                      local_228._M_string_length._4_2_ = 0;
                                      local_228._M_string_length._6_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_228.field_2._8_2_ = 0;
                                      local_228.field_2._10_2_ = 0;
                                      local_228.field_2._12_2_ = 0;
                                      local_228.field_2._14_2_ = 0;
                                      bVar18 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_false>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_false> *)
                                                  &local_228,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar18) {
                                        local_228.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_228.field_2._8_2_ = 0xffff;
                                        local_228.field_2._10_2_ = 0xffff;
                                        local_228.field_2._12_2_ = 0xffff;
                                        local_228.field_2._14_2_ = 0xffff;
                                        local_228._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_228._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_228._M_string_length._0_4_ = 0xffffffff;
                                        local_228._M_string_length._4_2_ = 0xffff;
                                        local_228._M_string_length._6_2_ = 0xffff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      lVar15 = 0x1e;
                                      do {
                                        if (lVar15 == -2) goto LAB_00112e75;
                                        psVar3 = (short *)((long)local_1d8.values.
                                                                 super_array<unsigned_short,_16UL>.
                                                                 elems + lVar15);
                                        psVar1 = (short *)((long)&local_228._M_dataplus._M_p +
                                                          lVar15);
                                        lVar15 = lVar15 + -2;
                                      } while (*psVar3 == *psVar1);
                                      local_1fc = 0;
LAB_00112e75:
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar9 = iVar9 + 1;
                                    } while (iVar9 != 0x400);
                                    iVar9 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                                                ((uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8,(test_uintwide_t_edge *)0x0,false,0x4c,
                                                 (int)puVar16);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 2;
                                      puVar4 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar4 = *puVar4 | 0x800;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,
                                                 (uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_228._M_dataplus._M_p._0_4_ = 0;
                                      local_228._M_dataplus._M_p._4_4_ = 0;
                                      local_228._M_string_length._0_4_ = 0;
                                      local_228._M_string_length._4_2_ = 0;
                                      local_228._M_string_length._6_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_228.field_2._8_2_ = 0;
                                      local_228.field_2._10_2_ = 0;
                                      local_228.field_2._12_2_ = 0;
                                      local_228.field_2._14_2_ = 0;
                                      bVar18 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_true>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                  &local_228,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar18) {
                                        local_228.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_228.field_2._8_2_ = 0xffff;
                                        local_228.field_2._10_2_ = 0xffff;
                                        local_228.field_2._12_2_ = 0xffff;
                                        local_228._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_228._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_228._M_string_length._0_4_ = 0xffffffff;
                                        local_228._M_string_length._4_2_ = 0xffff;
                                        local_228._M_string_length._6_2_ = 0xffff;
                                        local_228.field_2._14_2_ = 0x7fff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      if (-1 < (short)(local_1d8.values.
                                                       super_array<unsigned_short,_16UL>.elems[0xf]
                                                      ^ local_228.field_2._14_2_)) {
                                        lVar15 = 0x1e;
                                        do {
                                          if (lVar15 == -2) goto LAB_00112fad;
                                          psVar3 = (short *)((long)local_1d8.values.
                                                                   super_array<unsigned_short,_16UL>
                                                                   .elems + lVar15);
                                          psVar1 = (short *)((long)&local_228._M_dataplus._M_p +
                                                            lVar15);
                                          lVar15 = lVar15 + -2;
                                        } while (*psVar3 == *psVar1);
                                      }
                                      local_1fc = 0;
LAB_00112fad:
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar9 = iVar9 + 1;
                                    } while (iVar9 != 0x400);
                                    iVar9 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                                                ((uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8,(test_uintwide_t_edge *)0x0,true,0x40,
                                                 (int)puVar16);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 8;
                                      puVar4 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar4 = *puVar4 | 0x200;
                                      puVar4 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar4 = *puVar4 | 0x800;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,
                                                 (uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_228._M_dataplus._M_p._0_4_ = 0;
                                      local_228._M_dataplus._M_p._4_4_ = 0;
                                      local_228._M_string_length._0_4_ = 0;
                                      local_228._M_string_length._4_2_ = 0;
                                      local_228._M_string_length._6_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_228.field_2._8_2_ = 0;
                                      local_228.field_2._10_2_ = 0;
                                      local_228.field_2._12_2_ = 0;
                                      local_228.field_2._14_2_ = 0;
                                      bVar18 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_true>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                  &local_228,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar18) {
                                        local_228.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_228.field_2._8_2_ = 0xffff;
                                        local_228.field_2._10_2_ = 0xffff;
                                        local_228.field_2._12_2_ = 0xffff;
                                        local_228._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_228._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_228._M_string_length._0_4_ = 0xffffffff;
                                        local_228._M_string_length._4_2_ = 0xffff;
                                        local_228._M_string_length._6_2_ = 0xffff;
                                        local_228.field_2._14_2_ = 0x7fff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      if (-1 < (short)(local_1d8.values.
                                                       super_array<unsigned_short,_16UL>.elems[0xf]
                                                      ^ local_228.field_2._14_2_)) {
                                        lVar15 = 0x1e;
                                        do {
                                          if (lVar15 == -2) goto LAB_001130f7;
                                          psVar3 = (short *)((long)local_1d8.values.
                                                                   super_array<unsigned_short,_16UL>
                                                                   .elems + lVar15);
                                          psVar1 = (short *)((long)&local_228._M_dataplus._M_p +
                                                            lVar15);
                                          lVar15 = lVar15 + -2;
                                        } while (*psVar3 == *psVar1);
                                      }
                                      local_1fc = 0;
LAB_001130f7:
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar9 = iVar9 + 1;
                                    } while (iVar9 != 0x400);
                                    iVar9 = 0;
                                    do {
                                      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                                                ((uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8,(test_uintwide_t_edge *)0x0,true,0x55,
                                                 (int)puVar16);
                                      std::__cxx11::stringstream::stringstream(local_1b8);
                                      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18))
                                           = *(uint *)((long)auStack_190 +
                                                      *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5
                                             | 0x40;
                                      puVar4 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar4 = *puVar4 | 0x200;
                                      puVar4 = (uint *)((long)auStack_190 +
                                                       *(long *)(local_1a8[0] + -0x18));
                                      *puVar4 = *puVar4 | 0x800;
                                      math::wide_integer::operator<<
                                                ((basic_ostream<char,_std::char_traits<char>_> *)
                                                 local_1a8,
                                                 (uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                 &local_1d8);
                                      std::__cxx11::stringbuf::str();
                                      local_228._M_dataplus._M_p._0_4_ = 0;
                                      local_228._M_dataplus._M_p._4_4_ = 0;
                                      local_228._M_string_length._0_4_ = 0;
                                      local_228._M_string_length._4_2_ = 0;
                                      local_228._M_string_length._6_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._0_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._2_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._4_2_ = 0;
                                      local_228.field_2._M_allocated_capacity._6_2_ = 0;
                                      local_228.field_2._8_2_ = 0;
                                      local_228.field_2._10_2_ = 0;
                                      local_228.field_2._12_2_ = 0;
                                      local_228.field_2._14_2_ = 0;
                                      bVar18 = math::wide_integer::
                                               uintwide_t<256U,_unsigned_short,_void,_true>::
                                               rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_true> *)
                                                  &local_228,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                      if (!bVar18) {
                                        local_228.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                        local_228.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                        local_228.field_2._8_2_ = 0xffff;
                                        local_228.field_2._10_2_ = 0xffff;
                                        local_228.field_2._12_2_ = 0xffff;
                                        local_228._M_dataplus._M_p._0_4_ = 0xffffffff;
                                        local_228._M_dataplus._M_p._4_4_ = 0xffffffff;
                                        local_228._M_string_length._0_4_ = 0xffffffff;
                                        local_228._M_string_length._4_2_ = 0xffff;
                                        local_228._M_string_length._6_2_ = 0xffff;
                                        local_228.field_2._14_2_ = 0x7fff;
                                      }
                                      if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8
                                         ) {
                                        operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8)
                                                        ,CONCAT44(uStack_1e4,local_1e8) + 1);
                                      }
                                      if (-1 < (short)(local_1d8.values.
                                                       super_array<unsigned_short,_16UL>.elems[0xf]
                                                      ^ local_228.field_2._14_2_)) {
                                        lVar15 = 0x1e;
                                        do {
                                          if (lVar15 == -2) goto LAB_00113241;
                                          psVar3 = (short *)((long)local_1d8.values.
                                                                   super_array<unsigned_short,_16UL>
                                                                   .elems + lVar15);
                                          psVar1 = (short *)((long)&local_228._M_dataplus._M_p +
                                                            lVar15);
                                          lVar15 = lVar15 + -2;
                                        } while (*psVar3 == *psVar1);
                                      }
                                      local_1fc = 0;
LAB_00113241:
                                      std::__cxx11::stringstream::~stringstream(local_1b8);
                                      std::ios_base::~ios_base(local_138);
                                      iVar9 = iVar9 + 1;
                                    } while (iVar9 != 0x400);
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] = 0
                                    ;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf] =
                                         0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
                                    local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
                                    bVar18 = math::wide_integer::
                                             uintwide_t<256U,_unsigned_short,_void,_false>::
                                             rd_string(&local_1d8,"-0x1",0xffffffffffffffff,0);
                                    if (!bVar18) {
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[8] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[9] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[10] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xb]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xc]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xd]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xe]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0xf]
                                           = 0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[0] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[1] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[2] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[3] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[4] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[5] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[6] =
                                           0xffff;
                                      local_1d8.values.super_array<unsigned_short,_16UL>.elems[7] =
                                           0xffff;
                                    }
                                    std::__cxx11::stringstream::stringstream(local_1b8);
                                    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                                         *(uint *)((long)auStack_190 +
                                                  *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
                                    math::wide_integer::operator<<
                                              ((basic_ostream<char,_std::char_traits<char>_> *)
                                               local_1a8,&local_1d8);
                                    bVar14 = (byte)local_1fc;
                                    std::__cxx11::stringbuf::str();
                                    local_228._M_dataplus._M_p._0_4_ = 0;
                                    local_228._M_dataplus._M_p._4_4_ = 0;
                                    local_228._M_string_length._0_4_ = 0;
                                    local_228._M_string_length._4_2_ = 0;
                                    local_228._M_string_length._6_2_ = 0;
                                    local_228.field_2._M_allocated_capacity._0_2_ = 0;
                                    local_228.field_2._M_allocated_capacity._2_2_ = 0;
                                    local_228.field_2._M_allocated_capacity._4_2_ = 0;
                                    local_228.field_2._M_allocated_capacity._6_2_ = 0;
                                    local_228.field_2._8_2_ = 0;
                                    local_228.field_2._10_2_ = 0;
                                    local_228.field_2._12_2_ = 0;
                                    local_228.field_2._14_2_ = 0;
                                    bVar18 = math::wide_integer::
                                             uintwide_t<256U,_unsigned_short,_void,_false>::
                                             rd_string((
                                                  uintwide_t<256U,_unsigned_short,_void,_false> *)
                                                  &local_228,(char *)CONCAT44(uStack_1f4,local_1f8),
                                                  0xffffffffffffffff,0);
                                    if (!bVar18) {
                                      local_228.field_2._M_allocated_capacity._0_2_ = 0xffff;
                                      local_228.field_2._M_allocated_capacity._2_2_ = 0xffff;
                                      local_228.field_2._M_allocated_capacity._4_2_ = 0xffff;
                                      local_228.field_2._M_allocated_capacity._6_2_ = 0xffff;
                                      local_228.field_2._8_2_ = 0xffff;
                                      local_228.field_2._10_2_ = 0xffff;
                                      local_228.field_2._12_2_ = 0xffff;
                                      local_228.field_2._14_2_ = 0xffff;
                                      local_228._M_dataplus._M_p._0_4_ = 0xffffffff;
                                      local_228._M_dataplus._M_p._4_4_ = 0xffffffff;
                                      local_228._M_string_length._0_4_ = 0xffffffff;
                                      local_228._M_string_length._4_2_ = 0xffff;
                                      local_228._M_string_length._6_2_ = 0xffff;
                                    }
                                    if ((undefined4 *)CONCAT44(uStack_1f4,local_1f8) != &local_1e8)
                                    {
                                      operator_delete((undefined4 *)CONCAT44(uStack_1f4,local_1f8),
                                                      CONCAT44(uStack_1e4,local_1e8) + 1);
                                    }
                                    local_1e8 = 0xffffffff;
                                    uStack_1e4 = 0xffffffff;
                                    uStack_1e0 = 0xffffffff;
                                    uStack_1dc = 0xffffffff;
                                    local_1f8 = 0xffffffff;
                                    uStack_1f4 = 0xffffffff;
                                    uStack_1f0 = 0xffffffff;
                                    uStack_1ec = 0xffffffff;
                                    lVar15 = 0x1e;
                                    do {
                                      if (lVar15 == -2) goto LAB_00113372;
                                      psVar1 = (short *)((long)&local_228._M_dataplus._M_p + lVar15)
                                      ;
                                      psVar3 = (short *)((long)&local_1f8 + lVar15);
                                      lVar15 = lVar15 + -2;
                                    } while (*psVar1 == *psVar3);
                                    bVar14 = 0;
LAB_00113372:
                                    std::__cxx11::stringstream::~stringstream(local_1b8);
                                    std::ios_base::~ios_base(local_138);
                                    return (bool)(bVar14 & 1);
                                  }
                                  uVar13 = 0;
                                }
                              }
                            }
                          }
                        }
                        std::__throw_out_of_range_fmt
                                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,lVar15,uVar13);
                      }
                      uVar13 = 0;
                    }
                  }
                }
              }
            }
            std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",lVar15,
                       uVar13);
          }
          uVar13 = 0;
        }
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",lVar15,uVar13);
}

Assistant:

auto test_various_ostream_ops() -> bool
{
  auto result_is_ok = true;

  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(29363)));

    std::stringstream strm;

    strm << std::dec << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = '9';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '3';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = '6';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '3';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(41719)));

    std::stringstream strm;

    strm << std::hex << std::uppercase << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(5)))) = '0';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = 'X';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = 'A';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = 'F';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '7';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(29363)));

    std::stringstream strm;

    strm << std::oct << std::uppercase << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(5)))) = '0';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = '7';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = '1';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = '6';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '3';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto z = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT8_C(0)));

    {
      std::stringstream strm;

      strm << std::oct << z;

      const auto result_zero_print_as_oct_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_oct_is_ok && result_is_ok);
    }

    {
      std::stringstream strm;

      strm << std::dec << z;

      const auto result_zero_print_as_dec_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_dec_is_ok && result_is_ok);
    }

    {
      std::stringstream strm;

      strm << std::hex << z;

      const auto result_zero_print_as_hex_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_hex_is_ok && result_is_ok);
    }
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::dec,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits10
      );

    std::stringstream strm;

    strm << std::dec << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::hex,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / 4
      );

    std::stringstream strm;

    strm << std::hex << std::showbase << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::oct,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / 3
      );

    std::stringstream strm;

    strm << std::oct << std::showbase << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::dec,
        std::numeric_limits<local_uintwide_t_small_signed_type>::digits10
      );

    std::stringstream strm;

    strm << std::dec << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::hex,
        (std::numeric_limits<local_uintwide_t_small_signed_type>::digits + 1) / 4
      );

    std::stringstream strm;

    strm << std::hex << std::showbase << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::oct,
        (std::numeric_limits<local_uintwide_t_small_signed_type>::digits + 1) / 3
      );

    std::stringstream strm;

    strm << std::oct << std::showbase << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  {
    const local_uintwide_t_small_unsigned_type m1("-0x1");

    std::stringstream strm;

    strm << std::hex << m1;

    const local_uintwide_t_small_unsigned_type m1_from_strm(strm.str().c_str());

    const auto result_read_and_round_trip_neg_hex_str_is_ok =
    (
      m1_from_strm == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)()
    );

    result_is_ok = (result_read_and_round_trip_neg_hex_str_is_ok && result_is_ok);
  }

  return result_is_ok;
}